

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.cpp
# Opt level: O2

string * __thiscall
HttpResponse::GetHttpVersion_abi_cxx11_(string *__return_storage_ptr__,HttpResponse *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->_httpVersion);
  return __return_storage_ptr__;
}

Assistant:

string HttpResponse::GetHttpVersion() {
  return _httpVersion;
}